

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O3

Lista<int> * __thiscall Lista<int>::operator=(Lista<int> *this,Lista<int> *aCopiar)

{
  int iVar1;
  Nodo *pNVar2;
  Nodo *pNVar3;
  long lVar4;
  Lista<int> *pLVar5;
  int i;
  long lVar6;
  long lVar7;
  
  eliminarTodos(this);
  pNVar2 = aCopiar->_prim;
  if (pNVar2 != (Nodo *)0x0) {
    lVar7 = 0;
    do {
      pNVar2 = pNVar2->_sig;
      lVar7 = lVar7 + 1;
    } while (pNVar2 != (Nodo *)0x0);
    lVar6 = 0;
    do {
      pNVar2 = aCopiar->_prim;
      for (lVar4 = lVar6; lVar4 != 0; lVar4 = lVar4 + -1) {
        pNVar2 = pNVar2->_sig;
      }
      iVar1 = pNVar2->_valor;
      pNVar3 = (Nodo *)operator_new(0x18);
      pNVar2 = this->_ult;
      pNVar3->_valor = iVar1;
      pNVar3->_sig = (Nodo *)0x0;
      pNVar3->_ant = pNVar2;
      pLVar5 = (Lista<int> *)&pNVar2->_sig;
      if (this->_prim == (Nodo *)0x0) {
        pLVar5 = this;
      }
      pLVar5->_prim = pNVar3;
      this->_ult = pNVar3;
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  return this;
}

Assistant:

Lista<T>& Lista<T>::operator=(const Lista<T>& aCopiar) {
    this->eliminarTodos();
    int longitud = aCopiar.longitud();
    for(int i = 0; i < longitud; i++) {
        T iesimo = aCopiar.iesimo(i);
        this->agregarAtras(iesimo);
    }
    return *this;
}